

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineCam.cpp
# Opt level: O1

void __thiscall
chrono::geometry::ChLineCam::EvaluateCamPoint
          (ChLineCam *this,double par,ChVector<double> *res,double *g,double *q)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  bool bVar27;
  eChCamType eVar28;
  double dVar29;
  double dVar30;
  undefined8 uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  double dVar45;
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar49;
  undefined1 auVar57 [16];
  double dVar50;
  double dVar51;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  double dVar52;
  double dVar53;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  double dVar54;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  double dVar55;
  undefined1 auVar70 [16];
  double dVar56;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  double dVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  double local_c0;
  double local_a8;
  undefined1 local_98 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  
  *g = 0.0;
  *q = 0.0;
  if (res != (ChVector<double> *)&VNULL) {
    res->m_data[0] = VNULL;
    res->m_data[1] = DAT_00b90ac0;
    res->m_data[2] = DAT_00b90ac8;
  }
  dVar29 = (par + par) * 3.141592653589793;
  bVar1 = this->internal;
  bVar27 = this->negative;
  dVar54 = dVar29;
  if (bVar27 == true) {
    local_c0 = -1.0;
    if ((this->type == CAM_TYPE_FLATOSCILLATE) || (this->type == CAM_TYPE_ROTATEFOLLOWER)) {
      local_a8 = 1.0;
      dVar54 = 6.283185307179586 - dVar29;
    }
    else {
      local_a8 = -1.0;
    }
  }
  else {
    local_a8 = 1.0;
    local_c0 = 1.0;
  }
  dVar46 = this->Rr;
  dVar51 = this->e;
  dVar49 = dVar54;
  (*((this->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  (*((this->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[5])();
  dVar56 = 0.0;
  (*((this->law).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[6])();
  if (CAM_TYPE_FLATOSCILLATE < this->type) {
    *g = 0.0;
    local_98 = ZEXT816(0);
    local_a8 = 0.0;
    goto LAB_00820100;
  }
  dVar45 = (double)((ulong)(bVar1 & 1) * (long)-dVar46 + (ulong)!(bool)(bVar1 & 1) * (long)dVar46);
  dVar46 = (double)((ulong)(bVar27 & 1) * (long)-dVar51 + (ulong)!(bool)(bVar27 & 1) * (long)dVar51)
  ;
  dVar49 = dVar49 * local_c0;
  dVar54 = local_a8 * dVar54;
  dVar56 = local_a8 * dVar56;
  switch(this->type) {
  case CAM_TYPE_SLIDEFOLLOWER:
    dVar51 = atan(dVar54 / (dVar49 + this->Rb));
    *g = dVar51;
    dVar46 = dVar49 + this->Rb;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = dVar45;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = dVar46 * dVar46;
    auVar48 = vfmadd231sd_fma(auVar111,auVar35,auVar35);
    auVar73._0_8_ = cos(dVar51);
    auVar73._8_56_ = extraout_var;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = auVar48._0_8_;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = dVar45 * -2.0 * dVar46;
    auVar48 = vfmadd213sd_fma(auVar57,auVar73._0_16_,auVar2);
    if (auVar48._0_8_ < 0.0) {
      local_a8 = sqrt(auVar48._0_8_);
    }
    else {
      auVar48 = vsqrtsd_avx(auVar48,auVar48);
      local_a8 = auVar48._0_8_;
    }
    dVar46 = sin(*g);
    dVar46 = asin((dVar46 * dVar45) / local_a8);
    auVar99._8_8_ = 0;
    auVar99._0_8_ = this->Rb;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar45;
    uVar31 = vcmpsd_avx512f(auVar99,auVar18,1);
    bVar1 = (bool)((byte)uVar31 & 1);
    dVar50 = (double)((ulong)bVar1 * (long)(3.141592653589793 - dVar46) +
                     (ulong)!bVar1 * (long)dVar46);
    dVar46 = this->Rb + dVar49;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = dVar54;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = dVar46 * dVar46;
    auVar48 = vfmadd231sd_fma(auVar68,auVar100,auVar100);
    dVar88 = pow(auVar48._0_8_,1.5);
    dVar49 = dVar49 + this->Rb;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = dVar56;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = dVar49;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = dVar49 * dVar49;
    auVar48 = vfnmadd213sd_fma(auVar118,auVar101,auVar116);
    auVar102._8_8_ = 0;
    auVar102._0_8_ = dVar54 * dVar54;
    auVar48 = vfmadd132sd_fma(auVar102,auVar48,ZEXT816(0x4000000000000000));
    dVar54 = auVar48._0_8_;
    goto LAB_0081fef4;
  case CAM_TYPE_ROTATEFOLLOWER:
    dVar88 = dVar49 + this->b0;
    dVar46 = this->p;
    dVar52 = sin(dVar88);
    dVar30 = 1.0 - dVar54;
    dVar51 = this->p;
    dVar50 = this->d;
    dVar53 = cos(dVar88);
    auVar62._8_8_ = 0;
    auVar62._0_8_ = dVar30;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dVar50;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = dVar53 * dVar51;
    auVar48 = vfnmadd213sd_fma(auVar91,auVar62,auVar4);
    dVar52 = atan2(dVar30 * dVar52 * dVar46,auVar48._0_8_);
    *g = (1.5707963267948966 - dVar88) - dVar52;
    dVar46 = this->p;
    dVar51 = sin(dVar88);
    dVar50 = sin(dVar52);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar45;
    auVar34._8_8_ = 0x8000000000000000;
    auVar34._0_8_ = 0x8000000000000000;
    auVar47 = vxorpd_avx512vl(auVar36,auVar34);
    auVar92._8_8_ = 0;
    auVar92._0_8_ = dVar51;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar46;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = dVar50 * dVar45;
    auVar48 = vfmsub231sd_fma(auVar63,auVar92,auVar5);
    dVar46 = this->p;
    dVar51 = this->d;
    auVar76._0_8_ = cos(dVar88);
    auVar76._8_56_ = extraout_var_02;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = dVar51;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar46;
    auVar3 = vfnmadd132sd_fma(auVar76._0_16_,auVar93,auVar6);
    auVar77._0_8_ = cos(dVar52);
    auVar77._8_56_ = extraout_var_03;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = auVar3._0_8_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar45;
    auVar3 = vfnmadd132sd_fma(auVar77._0_16_,auVar94,auVar7);
    dVar46 = auVar3._0_8_ * auVar3._0_8_ + auVar48._0_8_ * auVar48._0_8_;
    if (dVar46 < 0.0) {
      local_a8 = sqrt(dVar46);
    }
    else {
      auVar64._8_8_ = 0;
      auVar64._0_8_ = dVar46;
      auVar48 = vsqrtsd_avx(auVar64,auVar64);
      local_a8 = auVar48._0_8_;
    }
    dVar46 = this->p;
    dVar51 = sin(dVar88);
    dVar50 = sin(dVar52);
    local_98._0_8_ = auVar47._0_8_;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = dVar51;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar46;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = dVar50 * (double)local_98._0_8_;
    auVar48 = vfmadd231sd_fma(auVar69,auVar103,auVar19);
    dVar46 = this->p;
    dVar51 = this->d;
    auVar84._0_8_ = cos(dVar88);
    auVar84._8_56_ = extraout_var_10;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = dVar51;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar46;
    auVar3 = vfnmadd132sd_fma(auVar84._0_16_,auVar104,auVar20);
    auVar85._0_8_ = cos(dVar52);
    auVar85._8_56_ = extraout_var_11;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = auVar3._0_8_;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_98._0_8_;
    auVar3 = vfmadd231sd_fma(auVar105,auVar85._0_16_,auVar21);
    dVar50 = atan2(auVar48._0_8_,auVar3._0_8_);
    dVar46 = this->p;
    dVar88 = dVar88 + dVar52;
    dVar53 = cos(dVar88);
    dVar51 = this->p;
    dVar55 = sin(dVar88);
    auVar106._8_8_ = 0;
    auVar106._0_8_ = dVar53;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar30 * dVar46 * dVar54;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = dVar55 * dVar56 * dVar51;
    auVar3 = vfmsub231sd_fma(auVar70,auVar106,auVar22);
    dVar54 = this->d;
    dVar51 = cos(dVar52);
    dVar46 = this->p;
    dVar56 = cos(dVar88);
    auVar107._8_8_ = 0;
    auVar107._0_8_ = dVar51;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar54;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = dVar56 * dVar30 * dVar46;
    auVar47 = vfmsub231sd_fma(auVar71,auVar107,auVar23);
    dVar54 = this->p;
    dVar46 = cos(dVar49 + this->b0);
    auVar72._8_8_ = 0;
    auVar72._0_8_ = dVar30;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = this->d;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = dVar46 * dVar54;
    auVar48 = vfmadd213sd_fma(auVar108,auVar72,auVar24);
    dVar54 = cos(dVar52);
    dVar88 = auVar48._0_8_ / (dVar54 * (auVar3._0_8_ / auVar47._0_8_ + 1.0));
    goto LAB_008200f5;
  case CAM_TYPE_ECCENTRICFOLLOWER:
    auVar90._8_8_ = 0;
    auVar90._0_8_ = this->Rb;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = this->e * this->e;
    auVar48 = vfmsub231sd_fma(auVar60,auVar90,auVar90);
    if (auVar48._0_8_ < 0.0) {
      dVar51 = sqrt(auVar48._0_8_);
    }
    else {
      auVar48 = vsqrtsd_avx(auVar48,auVar48);
      dVar51 = auVar48._0_8_;
    }
    dVar49 = dVar49 + dVar51;
    dVar51 = atan((dVar54 - dVar46) / dVar49);
    *g = dVar51;
    auVar80._0_8_ = cos(dVar51);
    auVar80._8_56_ = extraout_var_06;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = dVar45;
    auVar33._8_8_ = 0x8000000000000000;
    auVar33._0_8_ = 0x8000000000000000;
    auVar47 = vxorpd_avx512vl(auVar37,auVar33);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar49;
    auVar3 = vfnmadd213sd_fma(auVar80._0_16_,auVar37,auVar11);
    auVar81._0_8_ = sin(*g);
    auVar81._8_56_ = extraout_var_07;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar45;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar46;
    auVar48 = vfmadd213sd_fma(auVar81._0_16_,auVar38,auVar12);
    dVar51 = auVar48._0_8_ * auVar48._0_8_ + auVar3._0_8_ * auVar3._0_8_;
    if (dVar51 < 0.0) {
      local_a8 = sqrt(dVar51);
    }
    else {
      auVar67._8_8_ = 0;
      auVar67._0_8_ = dVar51;
      auVar48 = vsqrtsd_avx(auVar67,auVar67);
      local_a8 = auVar48._0_8_;
    }
    auVar82._0_8_ = sin(*g);
    auVar82._8_56_ = extraout_var_08;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = dVar46;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar45;
    auVar48 = vfmadd132sd_fma(auVar82._0_16_,auVar41,auVar13);
    auVar83._0_8_ = cos(*g);
    auVar83._8_56_ = extraout_var_09;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = dVar49;
    local_98._0_8_ = auVar47._0_8_;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_98._0_8_;
    auVar3 = vfmadd132sd_fma(auVar83._0_16_,auVar97,auVar14);
    dVar51 = atan(auVar48._0_8_ / auVar3._0_8_);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = dVar45;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = this->Rb;
    uVar31 = vcmpsd_avx512f(auVar39,auVar15,0xe);
    bVar1 = (bool)((byte)uVar31 & 1);
    dVar50 = (double)((ulong)bVar1 * (long)(dVar51 + 3.141592653589793) +
                     (ulong)!bVar1 * (long)dVar51);
    dVar51 = dVar46 - dVar54;
    dVar88 = pow(dVar51 * dVar51 + dVar49 * dVar49,1.5);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = dVar46;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = dVar54;
    auVar48 = vfmadd231sd_fma(auVar42,auVar114,ZEXT816(0xc000000000000000));
    auVar115._8_8_ = 0;
    auVar115._0_8_ = dVar49 * dVar49;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar51;
    auVar48 = vfmadd132sd_fma(auVar48,auVar115,auVar16);
    auVar98._8_8_ = 0;
    auVar98._0_8_ = dVar56;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar49;
    auVar48 = vfnmadd132sd_fma(auVar98,auVar48,auVar17);
    dVar54 = auVar48._0_8_;
LAB_0081fef4:
    dVar88 = dVar88 / dVar54;
LAB_008200f5:
    local_98._8_8_ = 0;
    local_98._0_8_ = dVar50 + dVar29;
    dVar46 = dVar88 - dVar45;
    break;
  case CAM_TYPE_FLAT:
    *g = 0.0;
    dVar46 = dVar49 + this->Rb;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = dVar46 * dVar46;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = dVar54;
    auVar48 = vfmadd231sd_fma(auVar61,auVar117,auVar117);
    if (auVar48._0_8_ < 0.0) {
      local_a8 = sqrt(auVar48._0_8_);
    }
    else {
      auVar48 = vsqrtsd_avx(auVar48,auVar48);
      local_a8 = auVar48._0_8_;
    }
    dVar54 = atan2(dVar54,dVar49 + this->Rb);
    local_98._8_8_ = 0;
    local_98._0_8_ = dVar54 + dVar29;
    dVar46 = dVar49 + this->Rb + dVar56;
    break;
  case CAM_TYPE_FLATOSCILLATE:
    dVar49 = dVar49 + this->b0;
    dVar51 = this->d;
    dVar50 = cos(dVar49);
    dVar45 = 1.0 - dVar54;
    dVar88 = (dVar50 * dVar51) / dVar45;
    dVar51 = atan2(dVar46,dVar88);
    *g = dVar51;
    dVar51 = this->d;
    auVar74._0_8_ = sin(dVar49);
    auVar74._8_56_ = extraout_var_00;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = dVar46;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = dVar51;
    auVar48 = vfnmadd213sd_fma(auVar74._0_16_,auVar40,auVar48);
    auVar75._0_8_ = cos(dVar49);
    auVar75._8_56_ = extraout_var_01;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar88;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = auVar48._0_8_;
    auVar3 = vfnmadd213sd_fma(auVar75._0_16_,auVar43,auVar3);
    dVar51 = sin(dVar49);
    dVar50 = cos(dVar49);
    auVar89._8_8_ = 0;
    auVar89._0_8_ = dVar51;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = dVar88;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = dVar50 * dVar46;
    auVar48 = vfmsub231sd_fma(auVar58,auVar89,auVar47);
    dVar51 = auVar48._0_8_ * auVar48._0_8_ + auVar3._0_8_ * auVar3._0_8_;
    if (dVar51 < 0.0) {
      local_a8 = sqrt(dVar51);
    }
    else {
      auVar59._8_8_ = 0;
      auVar59._0_8_ = dVar51;
      auVar48 = vsqrtsd_avx(auVar59,auVar59);
      local_a8 = auVar48._0_8_;
    }
    dVar51 = sin(dVar49);
    dVar50 = cos(dVar49);
    auVar95._8_8_ = 0;
    auVar95._0_8_ = dVar51;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar88;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = dVar50 * -dVar46;
    auVar3 = vfmadd231sd_fma(auVar65,auVar95,auVar8);
    dVar51 = this->d;
    auVar78._0_8_ = sin(dVar49);
    auVar78._8_56_ = extraout_var_04;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = dVar51;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = -dVar46;
    auVar48 = vfmadd132sd_fma(auVar78._0_16_,auVar96,auVar9);
    auVar79._0_8_ = cos(dVar49);
    auVar79._8_56_ = extraout_var_05;
    auVar44._8_8_ = 0x8000000000000000;
    auVar44._0_8_ = -dVar88;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = auVar48._0_8_;
    auVar48 = vfmadd213sd_fma(auVar44,auVar79._0_16_,auVar10);
    dVar51 = atan2(auVar3._0_8_,auVar48._0_8_);
    local_98._8_8_ = 0;
    local_98._0_8_ = dVar51 + dVar29;
    dVar29 = this->d;
    dVar51 = sin(dVar49);
    auVar112._8_8_ = 0;
    auVar112._0_8_ = dVar54;
    auVar48 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar112,ZEXT816(0x3ff0000000000000));
    auVar66._8_8_ = 0;
    auVar66._0_8_ = dVar51 * dVar29;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = dVar88 * dVar56;
    auVar48 = vfmadd231sd_fma(auVar113,auVar66,auVar48);
    dVar46 = auVar48._0_8_ / (dVar45 * dVar45) - dVar46;
  }
  *q = dVar46;
LAB_00820100:
  if (this->negative == true) {
    eVar28 = this->type;
    if ((eVar28 < CAM_TYPE_FLATOSCILLATE) && (eVar28 != CAM_TYPE_ROTATEFOLLOWER)) {
      local_98._8_8_ = 0;
      local_98._0_8_ = (double)local_98._0_8_ + 3.141592653589793;
    }
    if ((eVar28 == CAM_TYPE_FLATOSCILLATE) || (eVar28 == CAM_TYPE_ROTATEFOLLOWER)) {
      auVar32._8_8_ = 0x8000000000000000;
      auVar32._0_8_ = 0x8000000000000000;
      auVar48 = vxorpd_avx512vl(local_98,auVar32);
      local_98._0_8_ = auVar48._0_8_;
    }
  }
  res->m_data[2] = 0.0;
  dVar29 = (this->center).m_data[0];
  auVar86._0_8_ = cos((double)local_98._0_8_ + this->phase);
  auVar86._8_56_ = extraout_var_12;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = dVar29;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_a8;
  auVar48 = vfmadd132sd_fma(auVar86._0_16_,auVar109,auVar25);
  res->m_data[0] = auVar48._0_8_;
  dVar29 = (this->center).m_data[1];
  auVar87._0_8_ = sin((double)local_98._0_8_ + this->phase);
  auVar87._8_56_ = extraout_var_13;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = dVar29;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_a8;
  auVar48 = vfmadd132sd_fma(auVar87._0_16_,auVar110,auVar26);
  res->m_data[1] = auVar48._0_8_;
  return;
}

Assistant:

void ChLineCam::EvaluateCamPoint(double par, ChVector<>& res, double& g, double& q) const {
    double a = par * 2 * CH_C_PI;  // range : par 0..1 -> angle 0...2PI
    double r, f, b, B, fshift, y, ydx, ydxdx, sa, fxalpha, u, uh = 0;
    double sign, signdx, signdxdx;

    // defaults
    g = 0;
    q = 0;
    res = VNULL;

    double radius = internal ? -Rr : +Rr;
    double ecc = negative ? -e : +e;

    fxalpha = a;
    sign = signdx = signdxdx = +1;

    if (negative) {
        sign = signdx = signdxdx = -1;  // reverse sign

        if ((type == CAM_TYPE_ROTATEFOLLOWER) || (type == CAM_TYPE_FLATOSCILLATE)) {
            fxalpha = 2 * CH_C_PI - a;  // also reverse direction
            signdx = signdxdx = +1;
        }
    }

    y = sign * law->Get_y(fxalpha);
    ydx = signdx * law->Get_y_dx(fxalpha);
    ydxdx = signdxdx * law->Get_y_dxdx(fxalpha);

    switch (this->type) {
        case CAM_TYPE_SLIDEFOLLOWER:
            g = atan(ydx / (Rb + y));
            r = sqrt(radius * radius + pow(Rb + y, 2) - 2 * radius * (Rb + y) * cos(g));
            fshift = asin(radius * sin(g) / r);
            if (radius > Rb)
                fshift = CH_C_PI - fshift;
            f = a + fshift;
            q = pow(ydx * ydx + pow(Rb + y, 2), 1.5) / (pow(Rb + y, 2) - ydxdx * (Rb + y) + 2 * (ydx * ydx)) - radius;
            break;
        case CAM_TYPE_ROTATEFOLLOWER:
            b = b0 + y;
            u = atan2((p * sin(b) * (1 - ydx)), (d - p * cos(b) * (1 - ydx)));
            g = CH_C_PI / 2.0 - b - u;
            r = sqrt(pow(p * sin(b) - radius * sin(u), 2) + pow(d - p * cos(b) - radius * cos(u), 2));
            fshift = atan2((p * sin(b) - radius * sin(u)), (d - p * cos(b) - radius * cos(u)));
            f = (a + fshift);
            uh =
                (p * (1 - ydx) * ydx * cos(b + u) - p * ydxdx * sin(b + u)) / (d * cos(u) - p * (1 - ydx) * cos(b + u));
            q = ((p * cos(b0 + y) * (1 - ydx)) + d) / ((1 + uh) * cos(u)) - radius;
            break;
        case CAM_TYPE_ECCENTRICFOLLOWER: {
            double s_dist = Get_s();
            sa = s_dist + y;
            g = atan((ydx - ecc) / (s_dist + y));
            r = sqrt(pow((sa - radius * cos(g)), 2) + pow((ecc + radius * sin(g)), 2));
            fshift = atan((ecc + radius * sin(g)) / (sa - radius * cos(g)));
            if (radius > Rb)
                fshift = CH_C_PI + fshift;
            f = a + fshift;
            q = pow((pow(s_dist + y, 2) + pow(ecc - ydx, 2)), 1.5) /
                    (pow(s_dist + y, 2) + (ecc - ydx) * (ecc - 2 * ydx) - (s_dist + y) * ydxdx) -
                radius;
            break;
        }
        case CAM_TYPE_FLAT:
            g = 0;
            B = ydx;
            r = sqrt(pow(Rb + y, 2) + ydx * ydx);
            f = a + atan2(ydx, (Rb + y));
            q = Rb + y + ydxdx;
            break;
        case CAM_TYPE_FLATOSCILLATE:
            b = b0 + y;
            B = (d * cos(b)) / (1 - ydx);
            g = atan2(ecc, B);
            r = sqrt(pow(d - ecc * sin(b) - B * cos(b), 2) + pow(B * sin(b) - ecc * cos(b), 2));
            f = a + atan2((B * sin(b) - ecc * cos(b)), (d - ecc * sin(b) - B * cos(b)));
            q = (d * sin(b) * (1 - 2 * ydx) + B * ydxdx) / (pow(1 - ydx, 2)) - ecc;
            break;
        default:
            g = r = f = 0;
            break;
    }

    if (negative) {
        if ((type == CAM_TYPE_FLAT) || (type == CAM_TYPE_SLIDEFOLLOWER) || (type == CAM_TYPE_ECCENTRICFOLLOWER))
            f += CH_C_PI;  // polar 180

        if ((type == CAM_TYPE_ROTATEFOLLOWER) || (type == CAM_TYPE_FLATOSCILLATE)) {
            f = -f;  // y mirror
        }
    }

    res.z() = 0;
    res.x() = this->center.x() + r * cos(f + phase);
    res.y() = this->center.y() + r * sin(f + phase);
}